

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

bool __thiscall gmlc::networking::TcpServer::reConnect(TcpServer *this,milliseconds timeOut)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  undefined8 in_RSI;
  TcpServer *in_RDI;
  shared_ptr<gmlc::networking::TcpAcceptor> *acc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range2;
  bool partialConnect;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  atomic<bool> *in_stack_fffffffffffffea8;
  allocator<char> local_141 [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  TcpAcceptor *in_stack_ffffffffffffff08;
  atomic<bool> local_81 [65];
  undefined8 local_40;
  reference local_38;
  shared_ptr<gmlc::networking::TcpAcceptor> *local_30;
  __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
  local_28;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *local_20;
  byte local_11;
  undefined8 local_8;
  
  local_8 = in_RSI;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffea0,
             SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  local_11 = 0;
  local_20 = &in_RDI->acceptors;
  local_28._M_current =
       (shared_ptr<gmlc::networking::TcpAcceptor> *)
       std::
       vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_30 = (shared_ptr<gmlc::networking::TcpAcceptor> *)
             std::
             vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ::end(in_stack_fffffffffffffe98);
  do {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                      ((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                        *)in_stack_fffffffffffffe98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = CLI::std::atomic<bool>::load
                        (in_stack_fffffffffffffea8,
                         (memory_order)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      if ((bVar1) && ((local_11 & 1) != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                   (allocator<char> *)in_stack_fffffffffffffed0);
        logger(in_RDI,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::allocator<char>::~allocator(local_141);
      }
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffea8);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
               ::operator*(&local_28);
    std::
    __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7ce0c7);
    bVar1 = TcpAcceptor::isConnected((TcpAcceptor *)0x7ce0cf);
    if (bVar1) {
LAB_007ce3a5:
      local_11 = 1;
    }
    else {
      this_00 = std::
                __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x7ce0e4);
      local_40 = local_8;
      uVar2 = TcpAcceptor::connect(this_00,(int)local_8,__addr,in_ECX);
      if ((uVar2 & 1) != 0) goto LAB_007ce3a5;
      if ((local_11 & 1) == 0) {
        in_stack_fffffffffffffea0 = (string *)&local_f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                   (allocator<char> *)in_stack_fffffffffffffed0);
        std::
        __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x7ce297);
        TcpAcceptor::to_string_abi_cxx11_(in_stack_ffffffffffffff08);
        std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        logger(in_RDI,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::allocator<char>::~allocator(&local_f9);
      }
      else {
        in_stack_fffffffffffffea8 = local_81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                   (allocator<char> *)in_stack_fffffffffffffed0);
        std::
        __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x7ce154);
        TcpAcceptor::to_string_abi_cxx11_(in_stack_ffffffffffffff08);
        std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        logger(in_RDI,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
        std::allocator<char>::~allocator((allocator<char> *)local_81);
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffea0,
                 SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

bool TcpServer::reConnect(std::chrono::milliseconds timeOut)
{
    halted = false;
    bool partialConnect = false;
    for (auto& acc : acceptors) {
        if (!acc->isConnected()) {
            if (!acc->connect(timeOut)) {
                if (partialConnect) {
                    logger(
                        0,
                        std::string("unable to connect all acceptors on ") +
                            acc->to_string());
                } else {
                    logger(
                        0,
                        std::string("unable to connect on ") +
                            acc->to_string());
                }

                halted = true;
                continue;
            }
        }
        partialConnect = true;
    }
    if ((halted.load()) && (partialConnect)) {
        logger(0, "partial connection on acceptor");
    }
    return !halted;
}